

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EDLines.cpp
# Opt level: O1

void __thiscall EDLines::JoinCollinearLines(EDLines *this)

{
  int iVar1;
  int iVar2;
  bool bVar3;
  long lVar4;
  long lVar5;
  int iVar6;
  ulong uVar7;
  int changeIndex;
  int iVar8;
  pointer pLVar9;
  double *pdVar10;
  pointer pLVar11;
  int iVar12;
  int iVar13;
  byte bVar14;
  
  bVar14 = 0;
  if (this->linesNo < 1) {
    iVar8 = 0;
  }
  else {
    uVar7 = 0;
    iVar8 = -1;
    do {
      iVar6 = (int)uVar7;
      pLVar11 = (this->lines).super__Vector_base<LineSegment,_std::allocator<LineSegment>_>._M_impl.
                super__Vector_impl_data._M_start;
      iVar2 = pLVar11[uVar7].segmentNo;
      changeIndex = iVar8 + 1;
      if (changeIndex != iVar6) {
        pLVar11[changeIndex].len = pLVar11[uVar7].len;
        pLVar9 = pLVar11 + uVar7;
        pLVar11 = pLVar11 + changeIndex;
        for (lVar4 = 8; lVar4 != 0; lVar4 = lVar4 + -1) {
          pLVar11->a = pLVar9->a;
          pLVar9 = (pointer)((long)pLVar9 + ((ulong)bVar14 * -2 + 1) * 8);
          pLVar11 = (pointer)((long)pLVar11 + ((ulong)bVar14 * -2 + 1) * 8);
        }
      }
      iVar13 = 1;
      iVar8 = changeIndex;
      if ((int)(iVar6 + 1U) < this->linesNo) {
        lVar4 = (ulong)(iVar6 + 1U) * 0x48;
        do {
          pLVar11 = (this->lines).super__Vector_base<LineSegment,_std::allocator<LineSegment>_>.
                    _M_impl.super__Vector_impl_data._M_start;
          if (*(int *)((long)&pLVar11->segmentNo + lVar4) != iVar2) break;
          bVar3 = TryToJoinTwoLineSegments
                            (this,pLVar11 + iVar8,(LineSegment *)((long)&pLVar11->a + lVar4),iVar8);
          iVar12 = (int)uVar7;
          if ((!bVar3) && (iVar1 = iVar8 + 1, bVar3 = iVar12 != iVar8, iVar8 = iVar1, bVar3)) {
            pLVar11 = (this->lines).super__Vector_base<LineSegment,_std::allocator<LineSegment>_>.
                      _M_impl.super__Vector_impl_data._M_start;
            pLVar11[iVar1].len = *(int *)((long)&pLVar11->len + lVar4);
            pdVar10 = (double *)((long)&pLVar11->a + lVar4);
            pLVar11 = pLVar11 + iVar1;
            for (lVar5 = 8; lVar5 != 0; lVar5 = lVar5 + -1) {
              pLVar11->a = *pdVar10;
              pdVar10 = pdVar10 + (ulong)bVar14 * -2 + 1;
              pLVar11 = (pointer)((long)pLVar11 + ((ulong)bVar14 * -2 + 1) * 8);
            }
          }
          iVar13 = iVar13 + 1;
          lVar4 = lVar4 + 0x48;
          uVar7 = (ulong)(iVar12 + 1);
        } while (iVar12 + 2 < this->linesNo);
      }
      if (changeIndex != iVar8) {
        pLVar11 = (this->lines).super__Vector_base<LineSegment,_std::allocator<LineSegment>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        bVar3 = TryToJoinTwoLineSegments(this,pLVar11 + changeIndex,pLVar11 + iVar8,changeIndex);
        iVar8 = iVar8 - (uint)bVar3;
      }
      uVar7 = (ulong)(uint)(iVar13 + iVar6);
    } while (iVar13 + iVar6 < this->linesNo);
    iVar8 = iVar8 + 1;
  }
  this->linesNo = iVar8;
  return;
}

Assistant:

void EDLines::JoinCollinearLines()
{
	int lastLineIndex = -1;   //Index of the last line in the joined lines
	int i = 0;
	while (i < linesNo) {
		int segmentNo = lines[i].segmentNo;

		lastLineIndex++;
		if (lastLineIndex != i) 
			lines[lastLineIndex] = lines[i];
		
		int firstLineIndex = lastLineIndex;  // Index of the first line in this segment

		int count = 1;
		for (int j = i + 1; j< linesNo; j++) {
			if (lines[j].segmentNo != segmentNo) break;

			// Try to combine this line with the previous line in this segment
			if (TryToJoinTwoLineSegments(&lines[lastLineIndex], &lines[j],
				lastLineIndex) == false) {
				lastLineIndex++;
				if (lastLineIndex != j) 
					lines[lastLineIndex] = lines[j];
				
			} //end-if

			count++;
		} //end-for

		  // Try to join the first & last line of this segment
		if (firstLineIndex != lastLineIndex) {
			if (TryToJoinTwoLineSegments(&lines[firstLineIndex], &lines[lastLineIndex],
				firstLineIndex)) {
				lastLineIndex--;
			} //end-if
		} //end-if

		i += count;
	} //end-while

	linesNo = lastLineIndex + 1;
}